

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O0

uint32_t farmhash32_mk(char *s,size_t len)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  ulong uVar8;
  ulong in_RSI;
  char *in_RDI;
  uint32_t e;
  uint32_t d;
  uint32_t c;
  uint32_t b;
  uint32_t a;
  size_t iters;
  uint32_t a4;
  uint32_t a3;
  uint32_t a2;
  uint32_t a1;
  uint32_t a0;
  uint32_t f;
  uint32_t g;
  uint32_t h;
  uint32_t local_5c;
  uint32_t local_58;
  uint32_t in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  char *local_10;
  uint32_t local_4;
  
  if (in_RSI < 0x19) {
    if (in_RSI < 0xd) {
      if (in_RSI < 5) {
        local_58 = farmhash32_mk_len_0_to_4
                             (in_stack_ffffffffffffffc0,
                              CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                              in_stack_ffffffffffffffb4);
      }
      else {
        local_58 = farmhash32_mk_len_5_to_12
                             (in_stack_ffffffffffffffc0,
                              CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                              in_stack_ffffffffffffffb4);
      }
      local_5c = local_58;
    }
    else {
      local_5c = farmhash32_mk_len_13_to_24
                           (in_stack_ffffffffffffffc0,
                            CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                            in_stack_ffffffffffffffb4);
    }
    local_4 = local_5c;
  }
  else {
    uVar1 = (uint)in_RSI * -0x3361d2af;
    uVar2 = fetch32(in_RDI + (in_RSI - 4));
    uVar2 = ror32(uVar2 * -0x3361d2af,0x11);
    uVar3 = fetch32(in_RDI + (in_RSI - 8));
    uVar3 = ror32(uVar3 * -0x3361d2af,0x11);
    uVar4 = fetch32(in_RDI + (in_RSI - 0x10));
    uVar4 = ror32(uVar4 * -0x3361d2af,0x11);
    uVar5 = fetch32(in_RDI + (in_RSI - 0xc));
    uVar5 = ror32(uVar5 * -0x3361d2af,0x11);
    uVar6 = fetch32(in_RDI + (in_RSI - 0x14));
    uVar6 = ror32(uVar6 * -0x3361d2af,0x11);
    uVar2 = ror32(uVar2 * 0x1b873593 ^ (uint)in_RSI,0x13);
    ror32(uVar4 * 0x1b873593 ^ uVar2 * 5 + 0xe6546b64,0x13);
    uVar2 = ror32(uVar3 * 0x1b873593 ^ uVar1,0x13);
    ror32(uVar5 * 0x1b873593 ^ uVar2 * 5 + 0xe6546b64,0x13);
    ror32(uVar6 * 0x1b873593 + uVar1,0x13);
    uVar8 = (in_RSI - 1) / 0x14;
    local_10 = in_RDI;
    do {
      uVar2 = fetch32(local_10);
      fetch32(local_10 + 4);
      fetch32(local_10 + 8);
      uVar3 = fetch32(local_10 + 0xc);
      uVar4 = fetch32(local_10 + 0x10);
      uVar5 = mur(0,0x212594);
      uVar6 = mur(0,0x2125a9);
      uVar7 = mur(0,0x2125c8);
      uVar3 = uVar6 + uVar2 + uVar7 + uVar3;
      local_10 = local_10 + 0x14;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
    uVar2 = ror32(uVar3 + uVar6 + uVar2,0xb);
    uVar2 = ror32(uVar2 * -0x3361d2af,0x11);
    uVar3 = ror32(uVar3,0xb);
    uVar3 = ror32(uVar3 * -0x3361d2af,0x11);
    uVar2 = ror32(uVar5 + uVar4 + uVar2 * -0x3361d2af,0x13);
    uVar2 = ror32(uVar2 * 5 + 0xe6546b64,0x11);
    uVar2 = ror32(uVar2 * -0x3361d2af + uVar3 * -0x3361d2af,0x13);
    local_4 = ror32(uVar2 * 5 + 0xe6546b64,0x11);
    local_4 = local_4 * -0x3361d2af;
  }
  return local_4;
}

Assistant:

uint32_t farmhash32_mk(const char *s, size_t len) {
  if (len <= 24) {
    return len <= 12 ?
        (len <= 4 ? farmhash32_mk_len_0_to_4(s, len, 0) : farmhash32_mk_len_5_to_12(s, len, 0)) :
        farmhash32_mk_len_13_to_24(s, len, 0);
  }

  // len > 24
  uint32_t h = len, g = c1 * len, f = g;
  uint32_t a0 = ror32(fetch32(s + len - 4) * c1, 17) * c2;
  uint32_t a1 = ror32(fetch32(s + len - 8) * c1, 17) * c2;
  uint32_t a2 = ror32(fetch32(s + len - 16) * c1, 17) * c2;
  uint32_t a3 = ror32(fetch32(s + len - 12) * c1, 17) * c2;
  uint32_t a4 = ror32(fetch32(s + len - 20) * c1, 17) * c2;
  h ^= a0;
  h = ror32(h, 19);
  h = h * 5 + 0xe6546b64;
  h ^= a2;
  h = ror32(h, 19);
  h = h * 5 + 0xe6546b64;
  g ^= a1;
  g = ror32(g, 19);
  g = g * 5 + 0xe6546b64;
  g ^= a3;
  g = ror32(g, 19);
  g = g * 5 + 0xe6546b64;
  f += a4;
  f = ror32(f, 19) + 113;
  size_t iters = (len - 1) / 20;
  do {
    uint32_t a = fetch32(s);
    uint32_t b = fetch32(s + 4);
    uint32_t c = fetch32(s + 8);
    uint32_t d = fetch32(s + 12);
    uint32_t e = fetch32(s + 16);
    h += a;
    g += b;
    f += c;
    h = mur(d, h) + e;
    g = mur(c, g) + a;
    f = mur(b + e * c1, f) + d;
    f += g;
    g += f;
    s += 20;
  } while (--iters != 0);
  g = ror32(g, 11) * c1;
  g = ror32(g, 17) * c1;
  f = ror32(f, 11) * c1;
  f = ror32(f, 17) * c1;
  h = ror32(h + g, 19);
  h = h * 5 + 0xe6546b64;
  h = ror32(h, 17) * c1;
  h = ror32(h + f, 19);
  h = h * 5 + 0xe6546b64;
  h = ror32(h, 17) * c1;
  return h;
}